

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void write_color(ostream *out,color *pixel_color)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  char local_4b [3];
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_20;
  
  dVar2 = (double)(-(ulong)!NAN(pixel_color->e[0]) & (ulong)pixel_color->e[0]);
  dVar6 = (double)(-(ulong)!NAN(pixel_color->e[1]) & (ulong)pixel_color->e[1]);
  dVar4 = (double)(-(ulong)!NAN(pixel_color->e[2]) & (ulong)pixel_color->e[2]);
  dVar3 = 0.0;
  uVar5 = 0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      uStack_40 = 0;
      uStack_30 = 0;
      local_48 = dVar4;
      local_38 = dVar6;
      dVar3 = sqrt(dVar2);
      dVar4 = local_48;
      uVar5 = uStack_40;
      dVar6 = local_38;
    }
    else {
      dVar3 = SQRT(dVar2);
    }
  }
  dVar2 = 0.0;
  if (0.0 < dVar6) {
    if (dVar6 < 0.0) {
      local_48 = dVar4;
      uStack_40 = uVar5;
      local_38 = dVar3;
      dVar2 = sqrt(dVar6);
      dVar3 = local_38;
      dVar4 = local_48;
    }
    else {
      dVar2 = SQRT(dVar6);
    }
  }
  dVar6 = 0.0;
  if (0.0 < dVar4) {
    if (dVar4 < 0.0) {
      local_48 = dVar2;
      local_38 = dVar3;
      dVar6 = sqrt(dVar4);
      dVar3 = local_38;
      dVar2 = local_48;
    }
    else {
      dVar6 = SQRT(dVar4);
    }
  }
  if (write_color(std::ostream&,vec3_const&)::intensity == '\0') {
    local_48 = dVar2;
    local_38 = dVar3;
    local_20 = dVar6;
    write_color();
    dVar6 = local_20;
    dVar3 = local_38;
    dVar2 = local_48;
  }
  dVar4 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar3) &&
     (dVar4 = write_color::intensity.max, dVar3 <= write_color::intensity.max)) {
    dVar4 = dVar3;
  }
  dVar3 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar2) &&
     (dVar3 = write_color::intensity.max, dVar2 <= write_color::intensity.max)) {
    dVar3 = dVar2;
  }
  dVar2 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar6) &&
     (dVar2 = write_color::intensity.max, dVar6 <= write_color::intensity.max)) {
    dVar2 = dVar6;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(int)(dVar4 * 256.0));
  local_4b[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)(dVar3 * 256.0));
  local_4b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)(dVar2 * 256.0));
  local_4b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_4b + 2,1);
  return;
}

Assistant:

void write_color(std::ostream& out, const color& pixel_color) {
    auto r = pixel_color.x();
    auto g = pixel_color.y();
    auto b = pixel_color.z();

    // Replace NaN components with zero.
    if (r != r) r = 0.0;
    if (g != g) g = 0.0;
    if (b != b) b = 0.0;

    // Apply a linear to gamma transform for gamma 2
    r = linear_to_gamma(r);
    g = linear_to_gamma(g);
    b = linear_to_gamma(b);

    // Translate the [0,1] component values to the byte range [0,255].
    static const interval intensity(0.000, 0.999);
    int rbyte = int(256 * intensity.clamp(r));
    int gbyte = int(256 * intensity.clamp(g));
    int bbyte = int(256 * intensity.clamp(b));

    // Write out the pixel color components.
    out << rbyte << ' ' << gbyte << ' ' << bbyte << '\n';
}